

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlNodeDumpOutput(xmlOutputBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format,
                      char *encoding)

{
  xmlDtdPtr pxVar1;
  int local_bc;
  int is_xhtml;
  xmlDtdPtr dtd;
  undefined1 auStack_a8 [4];
  int options;
  xmlSaveCtxt ctxt;
  char *encoding_local;
  int format_local;
  int level_local;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  xmlOutputBufferPtr buf_local;
  
  local_bc = 0;
  ctxt.escape = (xmlCharEncodingOutputFunc)encoding;
  xmlInitParser();
  if ((buf != (xmlOutputBufferPtr)0x0) && (cur != (xmlNodePtr)0x0)) {
    if (level < 0) {
      encoding_local._4_4_ = 0;
    }
    else {
      encoding_local._4_4_ = level;
      if (100 < level) {
        encoding_local._4_4_ = 100;
      }
    }
    if (ctxt.escape == (xmlCharEncodingOutputFunc)0x0) {
      ctxt.escape = (xmlCharEncodingOutputFunc)0x249736;
    }
    memset(auStack_a8,0,0x78);
    ctxt.buf._4_4_ = encoding_local._4_4_;
    _auStack_a8 = ctxt.escape;
    dtd._4_4_ = 0x20;
    if (format != 0) {
      dtd._4_4_ = 0x21;
    }
    ctxt.handler = (xmlCharEncodingHandlerPtr)buf;
    xmlSaveCtxtInit((xmlSaveCtxtPtr)auStack_a8,dtd._4_4_);
    pxVar1 = xmlGetIntSubset(doc);
    if ((pxVar1 != (xmlDtdPtr)0x0) &&
       (local_bc = xmlIsXHTML(pxVar1->SystemID,pxVar1->ExternalID), local_bc < 0)) {
      local_bc = 0;
    }
    if (local_bc == 0) {
      xmlNodeDumpOutputInternal((xmlSaveCtxtPtr)auStack_a8,cur);
    }
    else {
      xhtmlNodeDumpOutput((xmlSaveCtxtPtr)auStack_a8,cur);
    }
  }
  return;
}

Assistant:

void
xmlNodeDumpOutput(xmlOutputBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur,
                  int level, int format, const char *encoding)
{
    xmlSaveCtxt ctxt;
    int options;
#ifdef LIBXML_HTML_ENABLED
    xmlDtdPtr dtd;
    int is_xhtml = 0;
#endif

    (void) doc;

    xmlInitParser();

    if ((buf == NULL) || (cur == NULL)) return;

    if (level < 0)
        level = 0;
    else if (level > 100)
        level = 100;

    if (encoding == NULL)
        encoding = "UTF-8";

    memset(&ctxt, 0, sizeof(ctxt));
    ctxt.buf = buf;
    ctxt.level = level;
    ctxt.encoding = (const xmlChar *) encoding;

    options = XML_SAVE_AS_XML;
    if (format)
        options |= XML_SAVE_FORMAT;
    xmlSaveCtxtInit(&ctxt, options);

#ifdef LIBXML_HTML_ENABLED
    dtd = xmlGetIntSubset(doc);
    if (dtd != NULL) {
	is_xhtml = xmlIsXHTML(dtd->SystemID, dtd->ExternalID);
	if (is_xhtml < 0)
	    is_xhtml = 0;
    }

    if (is_xhtml)
        xhtmlNodeDumpOutput(&ctxt, cur);
    else
#endif
        xmlNodeDumpOutputInternal(&ctxt, cur);
}